

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

void arena_reset_finish_background_thread(tsd_t *tsd,uint arena_ind)

{
  background_thread_info_t *pbVar1;
  ulong uVar2;
  uint in_ESI;
  background_thread_info_t *info;
  _Bool result;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  atomic_b_t *tsdn;
  
  pbVar1 = background_thread_info;
  tsdn = &background_thread_enabled_state;
  uVar3 = 0;
  if ((background_thread_enabled_state.repr & 1U) != 0) {
    uVar2 = (ulong)in_ESI % max_background_threads;
    malloc_mutex_lock((tsdn_t *)0x0,(malloc_mutex_t *)&background_thread_enabled_state);
    pbVar1[uVar2].state = background_thread_started;
    malloc_mutex_unlock((tsdn_t *)tsdn,(malloc_mutex_t *)CONCAT44(uVar3,in_stack_ffffffffffffff98));
  }
  malloc_mutex_unlock((tsdn_t *)tsdn,(malloc_mutex_t *)CONCAT44(uVar3,in_stack_ffffffffffffff98));
  return;
}

Assistant:

static void
arena_reset_finish_background_thread(tsd_t *tsd, unsigned arena_ind) {
	if (have_background_thread) {
		if (background_thread_enabled()) {
			background_thread_info_t *info =
			    background_thread_info_get(arena_ind);
			assert(info->state == background_thread_paused);
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			info->state = background_thread_started;
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
		malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);
	}
}